

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O0

void __thiscall Nes_Apu::irq_changed(Nes_Apu *this)

{
  long in_RDI;
  cpu_time_t new_irq;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0xe78);
  if ((*(byte *)(in_RDI + 0xe81) & 1) == 0 && (*(byte *)(in_RDI + 0x142c) & 1) == 0) {
    if (*(long *)(in_RDI + 0x1410) < local_10) {
      local_10 = *(long *)(in_RDI + 0x1410);
    }
  }
  else {
    local_10 = 0;
  }
  if ((local_10 != *(long *)(in_RDI + 0x1408)) &&
     (*(long *)(in_RDI + 0x1408) = local_10, *(long *)(in_RDI + 0x1430) != 0)) {
    (**(code **)(in_RDI + 0x1430))(*(undefined8 *)(in_RDI + 0x1438));
  }
  return;
}

Assistant:

void Nes_Apu::irq_changed()
{
	cpu_time_t new_irq = dmc.next_irq;
	if ( dmc.irq_flag | irq_flag ) {
		new_irq = 0;
	}
	else if ( new_irq > next_irq ) {
		new_irq = next_irq;
	}
	
	if ( new_irq != earliest_irq_ ) {
		earliest_irq_ = new_irq;
		if ( irq_notifier_ )
			irq_notifier_( irq_data );
	}
}